

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

int parse_defopcode(SymbolTable *sym,List *new)

{
  byte bVar1;
  char *__dest;
  long lVar2;
  byte bVar3;
  char **ppcVar4;
  ListStruct *pLVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  void *pvVar9;
  ListStruct *pLVar10;
  List *pLVar11;
  List *pLVar12;
  ListStruct *pLVar13;
  char cVar14;
  long *plVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  List *native;
  long lVar19;
  ulong uVar20;
  byte *__src;
  ulong auStack_8970 [2];
  char *bits_to_expand [64] [64];
  char buf [256];
  List *pLStack_528;
  List *code_backup [64];
  int num_bits_to_expand [64];
  anon_union_8_7_0ba269be_for_u local_220;
  anon_union_8_7_0ba269be_for_u local_218;
  ListStruct *local_210;
  List *local_208;
  anon_union_8_7_0ba269be_for_u local_200;
  char acStack_1f8 [256];
  void *local_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  ListStruct local_e0;
  List local_b0;
  char **local_80;
  SymbolTable *local_78;
  ulong local_70;
  void *local_68;
  ulong local_60;
  long *local_58;
  ListStruct *local_50;
  uint *local_48;
  long *local_40;
  ListStruct *local_38;
  
  local_b0.car = &local_e0;
  local_e0.car = (ListStruct *)0x0;
  local_b0.cdr = (ListStruct *)0x0;
  local_e0.token.filename = (new->token).filename;
  local_e0.token.lineno = (new->token).lineno;
  local_b0.token._4_4_ = *(undefined4 *)&(new->token).field_0x4;
  local_b0.token.filename._0_4_ = *(undefined4 *)&(new->token).filename;
  local_b0.token.filename._4_4_ = *(undefined4 *)((long)&(new->token).filename + 4);
  local_b0.token.lineno._0_4_ = (undefined4)(new->token).lineno;
  local_b0.token.lineno._4_4_ = *(undefined4 *)((long)&(new->token).lineno + 4);
  local_e0.token._4_4_ = SUB84((ulong)*(undefined8 *)&new->token >> 0x20,0);
  local_e0.token.type = TOK_DEFOPCODE;
  local_b0.token.type = TOK_LIST;
  local_b0.token.u.string = (char *)0x0;
  local_e0.token.u.string = "defopcode";
  local_e0.cdr = new;
  if (((new->token).type - TOK_IDENTIFIER < 2) && ((new->token).u.string != (char *)0x0)) {
    auStack_8970[0] = 0x10690f;
    reduce(&local_b0,sym,0);
    iVar7 = 1;
    if (preprocess_only == FALSE) {
      pLVar11 = (local_b0.car)->cdr->cdr->car->cdr;
      auStack_8970[0] = 0x10693e;
      uVar6 = list_length(&local_e0);
      auStack_8970[0] = 0x106949;
      iVar7 = list_length(pLVar11);
      if (iVar7 == 4) {
        if ((int)uVar6 < 0x44) {
          auStack_8970[0] = 0x1069c7;
          local_78 = sym;
          local_40 = (long *)(ulong)uVar6;
          memset(&local_218,0,0x138);
          local_220 = ((local_b0.car)->cdr->token).u;
          local_218.n._0_4_ = *(undefined4 *)&(pLVar11->token).u;
          local_210 = pLVar11->cdr;
          local_208 = local_210->cdr;
          if ((local_208->token).type == TOK_LIST) {
            pLVar12 = (List *)&local_208->car;
            while (pLVar12 = pLVar12->cdr, pLVar12 != (List *)0x0) {
              switch((pLVar12->token).type) {
              case TOK_ENDS_BLOCK:
                local_f0 = 1;
                break;
              case TOK_DONT_POSTINCDEC_UNEXPANDED:
                local_e8 = 1;
                break;
              case TOK_NEXT_BLOCK_DYNAMIC:
                local_ec = 1;
                break;
              case TOK_SKIP_TWO_OPERAND_WORDS:
                local_e4 = 2;
                break;
              case TOK_SKIP_FOUR_OPERAND_WORDS:
              case TOK_SKIP_ONE_POINTER:
                local_e4 = 4;
                break;
              case TOK_SKIP_TWO_POINTERS:
                local_e4 = 8;
                break;
              default:
                auStack_8970[0] = 0x106a57;
                pcVar17 = unparse_token(&pLVar12->token,(char *)(bits_to_expand[0x3f] + 0x3f));
                auStack_8970[0] = 0x106a67;
                parse_error(pLVar12,"Unknown misc flag: %s",pcVar17);
              }
            }
          }
          else {
            auStack_8970[0] = 0x106aad;
            parse_error(local_208,"Expecting a list of misc flags!\n");
          }
          local_200.n = local_200.n & 0xffffffffffffff00;
          pLVar11 = pLVar11->cdr->cdr->cdr;
          if ((pLVar11->token).type == TOK_LIST) {
            pLVar13 = pLVar11->car;
            iVar7 = (int)local_40;
            while (pLVar13 = pLVar13->cdr, pLVar13 != (ListStruct *)0x0) {
              auStack_8970[0] = 0x106ae8;
              strcat((char *)&local_200.n,(pLVar13->token).u.string);
            }
          }
          else {
            auStack_8970[0] = 0x106afb;
            parse_error(pLVar11,"Expecting explicit list of opcode bits.\n");
            local_200 = (anon_union_8_7_0ba269be_for_u)0x3030303030303030;
            builtin_strncpy(acStack_1f8,"00000000",9);
            iVar7 = (int)local_40;
          }
          local_70 = (ulong)(iVar7 - 3);
          auStack_8970[0] = 0x106b27;
          sVar8 = strlen((char *)&local_200.n);
          if ((sVar8 & 0xf) != 0) {
            auStack_8970[0] = 0x106b3c;
            parse_error(pLVar11,"Not a multiple of 16 opcode bits.\n");
            local_200 = (anon_union_8_7_0ba269be_for_u)0x3030303030303030;
            builtin_strncpy(acStack_1f8,"00000000",9);
          }
          sVar8 = (long)(int)local_70 * 0x28;
          uVar18 = sVar8 + 0x27 & 0xfffffffffffffff0;
          lVar2 = -uVar18;
          local_58 = (long *)((long)auStack_8970 + lVar2 + 8);
          *(size_t *)((long)auStack_8970 + (8 - uVar18)) = sVar8 + 0x18;
          *(undefined8 *)((long)bits_to_expand + lVar2) = 0x940504fe;
          *(undefined4 *)(sVar8 + 0x14 + (long)local_58) = 0x595141ee;
          pvVar9 = (void *)((long)bits_to_expand + lVar2 + 8);
          *(undefined8 *)((long)auStack_8970 + lVar2) = 0x106b95;
          memset(pvVar9,0,sVar8);
          local_68 = pvVar9;
          local_f8 = pvVar9;
          local_38 = (local_e0.cdr)->cdr;
          uVar18 = 0;
          plVar15 = (long *)(ulong)(iVar7 - 4);
          while( true ) {
            local_60 = uVar18;
            iVar7 = (int)plVar15;
            if (iVar7 < 0) break;
            local_50 = (ListStruct *)((ulong)plVar15 & 0xffffffff);
            local_38 = local_38->cdr;
            local_40 = (long *)(ulong)(iVar7 - 1);
            if (iVar7 != 0) {
              *(void **)((long)local_68 + (long)((long)&local_50[-1].token.lineno + 7) * 0x28 + 0x20
                        ) = (void *)((long)local_68 + (long)local_50 * 0x28);
            }
            pLVar13 = local_38->car->cdr;
            pcVar17 = (pLVar13->token).u.string;
            *(undefined8 *)((long)auStack_8970 + lVar2) = 0x106c0c;
            sVar8 = strlen(pcVar17);
            if (sVar8 != 5) {
              pLVar11 = pLVar13->cdr;
              *(undefined8 *)((long)auStack_8970 + lVar2) = 0x106c23;
              parse_error(pLVar11,"Need exactly five characters in cc bits specification.\n");
              pcVar17 = "-----";
            }
            local_80 = bits_to_expand[(long)((long)&local_50[-1].token.lineno + 7)] + 0x3f;
            local_48 = (uint *)((long)local_68 + (long)local_50 * 0x28);
            *(undefined8 *)((long)auStack_8970 + lVar2) = 0xb;
            uVar18 = *(ulong *)((long)auStack_8970 + lVar2);
            for (lVar19 = 0; lVar19 != 5; lVar19 = lVar19 + 1) {
              uVar20 = uVar18 & 0xffffffff;
              do {
                uVar16 = uVar20;
                if ((int)uVar16 < 0) {
                  pLVar11 = local_38->car->cdr;
                  *(undefined8 *)((long)auStack_8970 + lVar2) = 0x106cfe;
                  parse_error(pLVar11,"Unknown character \'%c\' in cc bit specification.\n");
                  goto LAB_00106cfe;
                }
                uVar20 = (ulong)((int)uVar16 - 1);
              } while (parse_defopcode::cc_bit_info[uVar16].character != pcVar17[4 - lVar19]);
              bVar1 = parse_defopcode::cc_bit_info[uVar16].field_0x1;
              bVar3 = (byte)lVar19;
              uVar6 = *local_48;
              *local_48 = (((bVar1 >> 3 & 1) << (bVar3 & 0x1f)) << 0x14 | uVar6) & 0x1f00000 |
                          (((bVar1 >> 2 & 1) << (bVar3 & 0x1f)) << 0xf | uVar6) & 0xf8000 |
                          ((bVar1 & 1) << (bVar3 & 0x1f) | uVar6) & 0xfe007c1f |
                          (((bVar1 >> 1 & 1) << (bVar3 & 0x1f)) << 5 | uVar6) & 0x3e0;
LAB_00106cfe:
            }
            pLVar11 = local_38->car->cdr->cdr;
            pcVar17 = (pLVar11->token).u.string;
            *(undefined8 *)((long)auStack_8970 + lVar2) = 0x106d21;
            sVar8 = strlen(pcVar17);
            if (sVar8 != 5) {
              *(undefined8 *)((long)auStack_8970 + lVar2) = 0x106d38;
              parse_error(pLVar11,"Need exactly five characters in cc bits specification.\n");
              pcVar17 = "-----";
            }
            pcVar17 = pcVar17 + 4;
            for (lVar19 = 0; pLVar5 = local_38, pLVar13 = local_50, ppcVar4 = local_80, lVar19 != 5;
                lVar19 = lVar19 + 1) {
              cVar14 = *pcVar17;
              *(undefined8 *)((long)auStack_8970 + lVar2) = 7;
              sVar8 = *(size_t *)((long)auStack_8970 + lVar2);
              *(undefined8 *)((long)auStack_8970 + lVar2) = 0x106d65;
              pvVar9 = memchr("-CNVXZ",(int)cVar14,sVar8);
              if (pvVar9 == (void *)0x0) {
                pLVar11 = local_38->car->cdr->cdr;
                *(undefined8 *)((long)auStack_8970 + lVar2) = 0x106d89;
                parse_error(pLVar11,
                            "Illegal character \'%c\' in cc bits needed specification.  Must be one of -,C,N,V,X,Z.\n"
                            ,(ulong)(uint)(int)cVar14);
                cVar14 = *pcVar17;
              }
              *local_48 = *local_48 | ((uint)(cVar14 != '-') << ((byte)lVar19 & 0x1f) & 0x1f) << 10;
              pcVar17 = pcVar17 + -1;
            }
            pLVar10 = local_38->car->cdr->cdr->cdr;
            pLVar11 = pLVar10->car;
            if ((pLVar11->token).type == TOK_EXPLICIT_LIST) {
              uVar20 = 0;
              while (pLVar11 = pLVar11->cdr, pLVar11 != (ListStruct *)0x0) {
                *(anon_union_8_7_0ba269be_for_u *)(ppcVar4 + uVar20) = (pLVar11->token).u;
                uVar20 = uVar20 + 1;
                num_bits_to_expand[(long)((long)&pLVar13[-1].token.lineno + 6)] = (int)uVar20;
              }
            }
            else {
              uVar20 = 0;
              *(undefined8 *)((long)auStack_8970 + lVar2) = 0x106e01;
              parse_error(pLVar11,"Expecting a list of bit pattern strings.\n");
              pLVar10 = pLVar5->car->cdr->cdr->cdr;
              pLVar13 = local_50;
            }
            uVar6 = (int)uVar20 + 1;
            num_bits_to_expand[(long)((long)&pLVar13[-1].token.lineno + 6)] = uVar6;
            uVar18 = (ulong)uVar6;
            if ((int)uVar20 < (int)local_60) {
              uVar18 = local_60 & 0xffffffff;
            }
            bits_to_expand[(long)((long)&pLVar13[-1].token.lineno + 7)]
            [(uVar20 & 0xffffffff) + 0x3f] = "----------------";
            pLVar13 = pLVar10->cdr;
            *(ListStruct **)(local_48 + 4) = pLVar13;
            if ((((pLVar13 != (ListStruct *)0x0) && (pLVar11 = pLVar13->car, pLVar11 != (List *)0x0)
                 ) && ((pLVar11->token).type == TOK_NATIVE_CODE)) &&
               (pLVar10 = pLVar13, (pLVar11->cdr->token).type != TOK_QUOTED_STRING)) {
              *(undefined8 *)((long)auStack_8970 + lVar2) = 0x106e7d;
              parse_error(pLVar11,"Faulty native code specifier.");
            }
            *(ListStruct **)(local_48 + 4) = pLVar10->cdr;
            local_48[6] = 0;
            local_48[7] = 0;
            plVar15 = local_40;
          }
          uVar20 = 0;
          uVar18 = local_70 & 0xffffffff;
          if ((int)local_70 < 1) {
            uVar18 = uVar20;
          }
          for (; uVar18 * 0x28 - uVar20 != 0; uVar20 = uVar20 + 0x28) {
            pLVar11 = *(List **)((long)local_58 + uVar20 + 0x20);
            *(undefined8 *)((long)auStack_8970 + lVar2) = 0x106ec8;
            verify_fields_exist((char *)&local_200.n,pLVar11);
          }
          plVar15 = local_58 + 4;
          *(undefined8 *)((long)auStack_8970 + lVar2) = 0x11;
          sVar8 = *(size_t *)((long)auStack_8970 + lVar2);
          for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
            *(undefined8 *)((long)auStack_8970 + lVar2) = 0x106eea;
            pvVar9 = malloc(sVar8);
            plVar15[-1] = (long)pvVar9;
            code_backup[uVar20 - 1] = (List *)*plVar15;
            plVar15 = plVar15 + 5;
          }
          uVar16 = 0;
          uVar20 = local_60 & 0xffffffff;
          if ((int)local_60 < 1) {
            uVar20 = uVar16;
          }
          local_60 = uVar20;
          local_40 = local_58 + 4;
          local_48 = (uint *)(uVar18 * 0x11);
          do {
            if (uVar16 == local_60) {
              if (local_58[1] == 0x940504fe) {
                lVar19 = *local_58;
                cVar14 = *(char *)((long)local_58 + lVar19 + -4);
                *(undefined8 *)((long)auStack_8970 + lVar2) = 1;
                if (cVar14 == -0x12) {
                  if (*(char *)((long)local_58 + lVar19 + -3) == 'A') {
                    if (*(char *)((long)local_58 + lVar19 + -2) == 'Q') {
                      if (*(char *)((long)local_58 + lVar19 + -1) == 'Y') {
                        return (int)*(undefined8 *)((long)auStack_8970 + lVar2);
                      }
                      pcVar17 = "___tempptr[___newsize-1] == FIREWALL_STOP_3";
                    }
                    else {
                      pcVar17 = "___tempptr[___newsize-2] == FIREWALL_STOP_2";
                    }
                  }
                  else {
                    pcVar17 = "___tempptr[___newsize-3] == FIREWALL_STOP_1";
                  }
                }
                else {
                  pcVar17 = "___tempptr[___newsize-4] == FIREWALL_STOP_0";
                }
              }
              else {
                pcVar17 = "((long *)___tempptr)[1] == FIREWALL_START";
              }
              *(code **)((long)auStack_8970 + lVar2) = string_to_list;
              __assert_fail(pcVar17,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/autc04[P]syn68k/syngen/parse.c"
                            ,0x1fc,"int parse_defopcode(SymbolTable *, List *)");
            }
            local_50 = local_210->cdr;
            local_38 = local_210;
            local_210->cdr = (ListStruct *)0x0;
            plVar15 = local_40;
            for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
              pLVar11 = code_backup[uVar20 - 1];
              *(undefined8 *)((long)auStack_8970 + lVar2) = 0x106f5e;
              pLVar11 = copy_list(pLVar11);
              *plVar15 = (long)pLVar11;
              plVar15 = plVar15 + 5;
            }
            uVar20 = 0;
LAB_00106f6d:
            if (uVar20 != uVar18) {
              pcVar17 = "----------------";
              if ((long)uVar16 < (long)num_bits_to_expand[uVar20 - 2]) {
                pcVar17 = bits_to_expand[uVar20 - 1][uVar16 + 0x3f];
              }
              lVar19 = (long)local_68 + uVar20 * 0x28 + 8;
              __dest = *(char **)lVar19;
              *(undefined8 *)((long)auStack_8970 + lVar2) = 0x106fb7;
              strcpy(__dest,pcVar17);
              pcVar17 = buf + uVar20 * 0x11 + -8;
              __src = *(byte **)lVar19;
              *(undefined8 *)((long)auStack_8970 + lVar2) = 0x106fd5;
              strcpy(pcVar17,(char *)__src);
              do {
                if (*pcVar17 == '-') {
                  *pcVar17 = 'x';
                }
                else if (*pcVar17 == '\0') goto LAB_00106ff2;
                pcVar17 = pcVar17 + 1;
              } while( true );
            }
            for (lVar19 = 0; local_48 != (uint *)lVar19; lVar19 = lVar19 + 0x11) {
              pcVar17 = (char *)((long)bits_to_expand[0x3f] + lVar19 + 0x1f8);
              *(undefined8 *)((long)auStack_8970 + lVar2) = 0x107039;
              iVar7 = strcmp(pcVar17,"xxxxxxxxxxxxxxxx");
              if (iVar7 != 0) {
                *(undefined8 *)((long)auStack_8970 + lVar2) = 0x107042;
                pLVar11 = alloc_list();
                (pLVar11->token).type = TOK_LIST;
                *(undefined8 *)((long)auStack_8970 + lVar2) = 0x107051;
                pLVar12 = alloc_list();
                pLVar11->car = pLVar12;
                (pLVar12->token).type = TOK_INTERSECT;
                (pLVar12->token).u.string = "intersect";
                *(undefined8 *)((long)auStack_8970 + lVar2) = 0x10706c;
                pLVar12 = alloc_list();
                pLVar11->car->cdr = pLVar12;
                (pLVar12->token).type = TOK_QUOTED_STRING;
                (pLVar12->token).u.string = pcVar17;
                pLVar11->car->cdr->cdr = local_210;
                local_210 = pLVar11;
              }
            }
            *(undefined8 *)((long)auStack_8970 + lVar2) = 0x1070af;
            generate_opcode((ParsedOpcodeInfo *)&local_220.reginfo,local_78);
            local_210 = local_38;
            local_38->cdr = local_50;
            uVar16 = uVar16 + 1;
          } while( true );
        }
        pcVar17 = 
        "Error: too many variants.  Only %d allowed.  To raise, change MAX_VARIANTS in defopcode.h.\n"
        ;
        uVar18 = 0x40;
      }
      else {
        auStack_8970[0] = 0x106992;
        uVar6 = list_length(pLVar11);
        pcVar17 = "Missing arguments; should be 4, found %d\n";
        uVar18 = (ulong)uVar6;
      }
      auStack_8970[0] = 0x1069a5;
      parse_error(pLVar11,pcVar17,uVar18);
      iVar7 = 0;
    }
  }
  else {
    iVar7 = 0;
    auStack_8970[0] = 0x106979;
    parse_error(new,"Invalid opcode name.  Ignoring...\n");
  }
  return iVar7;
LAB_00106ff2:
  if (*__src - 0x30 < 2) {
    *__src = 0x78;
  }
  else if (*__src == 0) goto code_r0x0010700a;
  __src = __src + 1;
  goto LAB_00106ff2;
code_r0x0010700a:
  uVar20 = uVar20 + 1;
  goto LAB_00106f6d;
}

Assistant:

static int
parse_defopcode (SymbolTable *sym, List *new)
{
  const char *name = NULL;
  List dummy1 = { /* new */ 0, NULL, { /* new->token */ 0 } };
  List dummy2 = { NULL, /* &dummy1 */ 0, { /* new->token */ 0 } };
  SAFE_DECL ();

  dummy1.cdr = new;
  dummy1.token = new->token;
  dummy2.car = &dummy1;
  dummy2.token = new->token;

  dummy1.token.type = TOK_DEFOPCODE;
  dummy1.token.u.string = "defopcode";
  dummy2.token.type = TOK_LIST;
  dummy2.token.u.string = NULL;

  if (new->token.type == TOK_QUOTED_STRING
      || new->token.type == TOK_IDENTIFIER)
    name = new->token.u.string;

  /* Make sure the opcode name is legitimate. */
  if (name == NULL)
    {
      parse_error (new, "Invalid opcode name.  Ignoring...\n");
      return 0;
    }

  /* Perform initial macro substitutions. */
  reduce (&dummy2, sym, 0);

  /* Generate the opcode. */
  if (!preprocess_only)
    {
      ParsedOpcodeInfo info;
      List *l = CDR (CADDAR (&dummy2)), *err;
      CCVariant *var;
      int num_variants;
      List *code_backup[MAX_VARIANTS];
      const char *bits_to_expand[MAX_VARIANTS][MAX_VARIANTS];
      int num_bits_to_expand[MAX_VARIANTS];
      int max_num_bits_to_expand = 0;
      int i;

      num_variants = list_length (&dummy1) - 3;
      if (list_length (l) != 4)
	{
	  parse_error (l, "Missing arguments; should be 4, found %d\n",
		       list_length (l));
	  return 0;
	}

      if (num_variants > MAX_VARIANTS)
	{
	  parse_error (l, "Error: too many variants.  Only %d allowed.  To "
		       "raise, change MAX_VARIANTS in defopcode.h.\n",
		       MAX_VARIANTS);
	  return 0;
	}

      /* Parse in the instruction information. */
      memset (&info, 0, sizeof info);
      info.name = CDAR (&dummy2)->token.u.string;
      info.cpu = l->token.u.n;
      info.amode = CDR (l);
      info.misc_flags = CDDR (l);

      if (info.misc_flags->token.type != TOK_LIST)
	parse_error (info.misc_flags, "Expecting a list of misc flags!\n");
      else
	{
	  List *ls;
	  for (ls = info.misc_flags->car; ls != NULL; ls = ls->cdr)
	    {
	      char buf[256];

	      switch (ls->token.type) {
	      case TOK_ENDS_BLOCK:
		info.ends_block = TRUE;
		break;
	      case TOK_DONT_POSTINCDEC_UNEXPANDED:
		info.dont_postincdec_unexpanded = TRUE;
		break;
	      case TOK_NEXT_BLOCK_DYNAMIC:
		info.next_block_dynamic = TRUE;
		break;
	      case TOK_SKIP_TWO_OPERAND_WORDS:
		info.operand_words_to_skip = 2;
		break;
	      case TOK_SKIP_FOUR_OPERAND_WORDS:
		info.operand_words_to_skip = 4;
		break;
	      case TOK_SKIP_ONE_POINTER:
	        info.operand_words_to_skip = PTR_WORDS;
	        break;
	      case TOK_SKIP_TWO_POINTERS:
	        info.operand_words_to_skip = PTR_WORDS * 2;
	        break;
	      default:
		parse_error (ls, "Unknown misc flag: %s",
			     unparse_token (&ls->token, buf));
		break;
	      }
	    }
	}

      info.opcode_bits[0] = '\0';
      err = CDDDR (l);  /* For later, in case we need it. */
      if (CDDDR (l)->token.type != TOK_LIST)
	{
	  parse_error (CDDDR (l), "Expecting explicit list of opcode bits.\n");
	  strcpy (info.opcode_bits, "0000000000000000");
	}
      else
	for (l = CDR (CADDDR (l)); l != NULL; l = l->cdr)
	  {
	    if (0 && strlen (l->token.u.string) != 16)
	      {
		/* This seems a little harsh... */
		parse_error (l, "Need exactly 16 characters in each bit "
			     "pattern specification string, found %d.\n",
			     strlen (l->token.u.string));
		strcat (info.opcode_bits, "0000000000000000");
	      }
	    else
	      strcat (info.opcode_bits, l->token.u.string);
	  }
      if (strlen (info.opcode_bits) % 16)
	{
	  parse_error (err, "Not a multiple of 16 opcode bits.\n");
	  strcpy (info.opcode_bits, "0000000000000000");
	}
      info.cc_variant = NULL;

      /* Parse the information for the cc variants. */
      var = (CCVariant *) SAFE_alloca (num_variants * sizeof (CCVariant));
      memset (var, 0, num_variants * sizeof (CCVariant));
      info.cc_variant = var;

      /* Loop through and parse each cc variant. */
      for (i = num_variants - 1, l = CDDDR (&dummy1); i >= 0; i--, l = l->cdr)
	{
	  static const struct {
	    char character;
	    unsigned char cc_may_set:1;
	    unsigned char cc_may_not_set:1;
	    unsigned char cc_to_known_value:1;
	    unsigned char cc_known_values:1;
	  } cc_bit_info[] = {
	    { '0', 1, 0, 1, 0 },    /* 0  ->  always force cc bit to 0.    */
	    { '1', 1, 0, 1, 1 },    /* 1  ->  always force cc bit to 1.    */
	    { 'C', 1, 0, 0, 0 },    /* Any letter means will always set    */
	    { 'N', 1, 0, 0, 0 },    /*     cc bit to either 0 or 1, but    */
	    { 'V', 1, 0, 0, 0 },    /*     we can't determine which at     */
	    { 'X', 1, 0, 0, 0 },    /*     compile time.                   */
	    { 'Z', 1, 0, 0, 0 },    /*                                     */
	    { '-', 0, 1, 0, 0 },    /* -  ->  cc bit always unchanged.     */
	    { '>', 1, 1, 0, 0 },    /* >  ->  cc set to 1 or unchanged.    */
	    { '<', 1, 1, 0, 0 },    /* <  ->  cc set to 0 or unchanged.    */
	    { '?', 1, 0, 0, 0 },    /* ?  ->  cc bit undefined.            */
	    { '%', 1, 1, 0, 0 },    /* %  ->  cc might change, might not.  */
	  };
	  int guess, bit;
	  const char *b;
	  List *bte;
	  
	  /* Insert them in reverse order. */
	  if (i > 0)
	    var[i - 1].next = &var[i];

	  /* Parse the cc bits set specs. */
	  b = (CDAR (l))->token.u.string;
	  if (strlen (b) != 5)
	    {
	      parse_error (CDDAR (l), "Need exactly five characters in "
			   "cc bits specification.\n");
	      b = "-----";
	    }
			 
	  for (bit = 0; bit < 5; bit++)
	    {
	      for (guess = sizeof cc_bit_info / sizeof cc_bit_info[0] - 1;
		   guess >= 0; guess--)
		if (cc_bit_info[guess].character == b[4 - bit])
		  {
		    var[i].cc_may_set |= cc_bit_info[guess].cc_may_set << bit;
		    var[i].cc_may_not_set
		      |= cc_bit_info[guess].cc_may_not_set << bit;
		    var[i].cc_to_known_value
		      |= cc_bit_info[guess].cc_to_known_value << bit;
		    var[i].cc_known_values
		      |= cc_bit_info[guess].cc_known_values << bit;
		    break;
		  }
	      if (guess < 0)
		parse_error (CDAR (l), "Unknown character '%c' in cc bit "
			     "specification.\n", b[4 - bit]);
	    }

	  /* Parse the cc bits needed specs. */
	  b = (CDDAR (l))->token.u.string;
	  if (strlen (b) != 5)
	    {
	      parse_error (CDDAR (l), "Need exactly five characters in "
			   "cc bits specification.\n");
	      b = "-----";
	    }
	  
	  for (bit = 0; bit < 5; bit++)
	    {
	      if (strchr ("-CNVXZ", b[4 - bit]) == NULL)
		parse_error (CDDAR (l), "Illegal character '%c' in cc bits "
			     "needed specification.  Must be one of "
			     "-,C,N,V,X,Z.\n",
			     b[4 - bit]);
	      var[i].cc_needed |= (b[4 - bit] != '-') << bit;
	    }


	  /* Fetch all of the bits_to_expand strings into an array.
	   * Terminate the list provided by the user with "----------------"
	   * so we guarantee that all legal bit patterns get code generated
	   * for them.
	   */
	  num_bits_to_expand[i] = 0;
	  bte = CADDR (CDAR (l));
	  if (bte->token.type != TOK_EXPLICIT_LIST)
	    parse_error (bte, "Expecting a list of bit pattern strings.\n");
	  else
	    {
	      for (bte = bte->cdr; bte != NULL; bte = bte->cdr)
		bits_to_expand[i][num_bits_to_expand[i]++]
		  = bte->token.u.string;
	    }
	  bits_to_expand[i][num_bits_to_expand[i]++]
	    = "----------------";
	  if (num_bits_to_expand[i] > max_num_bits_to_expand)
	    max_num_bits_to_expand = num_bits_to_expand[i];
	  var[i].code = CDDR (CDDAR (l));

	  {
	    List *native = CDDR (CDDAR (l));
	    if (native != NULL && CAR (native) != NULL
		&& (CAR (native))->token.type == TOK_NATIVE_CODE)
	      {
		if ((CDAR (native))->token.type != TOK_QUOTED_STRING)
		  parse_error (CAR (native), "Faulty native code specifier.");
#ifdef GENERATE_NATIVE_CODE

		{
		  char buf[1024];
		  List *xx;

		  buf[0] = '\0';
		  for (xx = CDAR (native); xx != NULL; xx = xx->cdr)
		    {
		      if (xx->token.type == TOK_QUOTED_STRING)
			strcat (buf, xx->token.u.string);
		      else
			parse_error (xx, "Expected string here.");
		    }
		  if (buf[0] == '\0' || !strcmp (buf, "none"))
		    var[i].native_code_info = NULL;
		  else
		    var[i].native_code_info = unique_string (buf);
		}
#endif
		var[i].code = native->cdr;
	      }
	    else
	      {
#ifdef GENERATE_NATIVE_CODE
		var[i].native_code_info = NULL;
#endif
		var[i].code = CDDR (CDDAR (l));
	      }
	  }

#ifndef GENERATE_NATIVE_CODE
	  var[i].native_code_info = NULL;
#endif
	}

      /* Verify that all of the fields they specified actually exist. */
      for (i = 0; i < num_variants; i++)
	verify_fields_exist (info.opcode_bits, var[i].code);

      /* Loop through and generate code for each bits_to_expand specified.
       * This is not elegant; originally, only one bits_to_expand string
       * could be specified, and its semantics were more limited than the
       * new, more powerful versions.  To compensate, we will call the
       * lower level routines once for each bits_to_expand string, and
       * modify the legal addressing mode expression to provide us with the
       * new literal bits matching capability of the new bits_to_expand
       * strings.
       */
      
      for (i = 0; i < num_variants; i++)
	{
/*
 * TODO:  FIXME -- I don't like "17" below
 */
	  /* We allocate 17 bytes because we can only expand up to 16
	   * bits, and we have one extra for the terminating 0.
	   */
	  var[i].bits_to_expand = (char *) malloc (17);
	  code_backup[i] = var[i].code;
	}

      for (i = 0; i < max_num_bits_to_expand; i++)
	{
	  char intersect[MAX_VARIANTS][17];
	  List *saved_amode = info.amode;
	  List *old_cdr = info.amode->cdr;
	  int j;
	  
	  info.amode->cdr = NULL;

	  /* Preserve code. */
	  for (j = 0; j < num_variants; j++)
	    var[j].code = copy_list (code_backup[j]);

	  /* Grab all of the bits_to_expand strings. */
	  for (j = 0; j < num_variants; j++)
	    {
	      char *p;
	      strcpy (var[j].bits_to_expand, ((i < num_bits_to_expand[j])
					      ? bits_to_expand[j][i]
					      : "----------------"));
	      
	      /* Generate the intersection string. */
	      strcpy (intersect[j], var[j].bits_to_expand);
	      for (p = intersect[j]; *p != '\0'; p++)
		if (*p == '-')
		  *p = 'x';
	      
	      /* Expand all literal bits by replacing them with 'x'.*/
	      for (p = var[j].bits_to_expand; *p != '\0'; p++)
		if (*p == '0' || *p == '1')
		  *p = 'x';
	    }
	  
	  /* Intersect with all of the literal bits we know about. */
	  for (j = 0; j < num_variants; j++)
	    if (strcmp (intersect[j], "xxxxxxxxxxxxxxxx"))
	      {
		List *isect = alloc_list ();
		isect->token.type = TOK_LIST;
		isect->car = alloc_list ();
		isect->car->token.type = TOK_INTERSECT;
		isect->car->token.u.string = "intersect";
		isect->car->cdr = alloc_list ();
		isect->car->cdr->token.type = TOK_QUOTED_STRING;
		isect->car->cdr->token.u.string = intersect[j];
		isect->car->cdr->cdr = info.amode;
		info.amode = isect;
	      }

	  /* Generate the actual code. */
	  generate_opcode (&info, sym);

	  /* Memory leak here, but who cares? */
	  info.amode = saved_amode;
	  info.amode->cdr = old_cdr;
	}
	ASSERT_SAFE(var);
    }

  return 1;
}